

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O2

bool QTimeZone::isTimeZoneIdAvailable(QByteArray *ianaId)

{
  QTimeZonePrivate *pQVar1;
  bool bVar2;
  int iVar3;
  qint64 qVar4;
  Type *pTVar5;
  storage_type *extraout_RDX;
  undefined1 uVar6;
  QUtcTimeZonePrivate *this;
  long in_FS_OFFSET;
  QByteArrayView id;
  QUtcTimeZonePrivate QStack_98;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QUtcTimeZonePrivate::QUtcTimeZonePrivate(&QStack_98);
  bVar2 = QUtcTimeZonePrivate::isTimeZoneIdAvailable(&QStack_98,ianaId);
  uVar6 = 1;
  if (!bVar2) {
    this = (QUtcTimeZonePrivate *)(ianaId->d).size;
    id.m_data = extraout_RDX;
    id.m_size = (qsizetype)(ianaId->d).ptr;
    qVar4 = QUtcTimeZonePrivate::offsetFromUtcString(this,id);
    if (qVar4 == -0x80000000) {
      pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::
               operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>
                           *)this);
      pQVar1 = (pTVar5->backend).d.ptr;
      iVar3 = (*pQVar1->_vptr_QTimeZonePrivate[0x14])(pQVar1,ianaId);
      uVar6 = (undefined1)iVar3;
    }
  }
  QUtcTimeZonePrivate::~QUtcTimeZonePrivate(&QStack_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QTimeZone::isTimeZoneIdAvailable(const QByteArray &ianaId)
{
#if defined(Q_OS_UNIX) && !(defined(Q_OS_ANDROID) || defined(Q_OS_DARWIN))
    // Keep #if-ery consistent with selection of QTzTimeZonePrivate in
    // newBackendTimeZone(). Skip the pre-check, as the TZ backend accepts POSIX
    // zone IDs, which need not be valid IANA IDs. See also QTBUG-112006.
#else
    // isValidId is not strictly required, but faster to weed out invalid
    // IDs as availableTimeZoneIds() may be slow
    if (!QTimeZonePrivate::isValidId(ianaId))
        return false;
#endif
    return QUtcTimeZonePrivate().isTimeZoneIdAvailable(ianaId)
        || QUtcTimeZonePrivate::offsetFromUtcString(ianaId) != QTimeZonePrivate::invalidSeconds()
        || global_tz->backend->isTimeZoneIdAvailable(ianaId);
}